

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

void rdr_freedat(dat_t *dat)

{
  seq_t *__ptr;
  ulong uVar1;
  
  if (dat->nseq != 0) {
    uVar1 = 0;
    do {
      __ptr = dat->seq[uVar1];
      free(__ptr->raw);
      free(__ptr);
      uVar1 = uVar1 + 1;
    } while (uVar1 < dat->nseq);
  }
  free(dat->seq);
  free(dat);
  return;
}

Assistant:

void rdr_freedat(dat_t *dat) {
	for (uint32_t i = 0; i < dat->nseq; i++)
		rdr_freeseq(dat->seq[i]);
	free(dat->seq);
	free(dat);
}